

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  undefined8 uVar7;
  ushort uVar8;
  ushort uVar9;
  BYTE *s;
  ushort *__src;
  char *__dest;
  long lVar10;
  size_t __n;
  BYTE *d_1;
  char *pcVar11;
  ulong uVar12;
  ushort *puVar13;
  char *pcVar14;
  char *pcVar15;
  BYTE *s_1;
  ushort *puVar16;
  char *pcVar17;
  BYTE *oCopyLimit;
  int local_50;
  int local_38;
  
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        return -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      pcVar3 = dest + (uint)maxOutputSize;
      pcVar1 = pcVar3 + -7;
      puVar16 = (ushort *)source;
      __dest = dest;
      do {
        while( true ) {
          __src = (ushort *)((long)puVar16 + 1);
          bVar4 = (byte)*puVar16;
          __n = (size_t)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) ||
             (dest + ((ulong)(uint)maxOutputSize - 0x20) < __dest)) goto LAB_0029b99b;
          uVar7 = *(undefined8 *)((long)puVar16 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar7;
          pcVar11 = __dest + __n;
          uVar12 = (ulong)(bVar4 & 0xf);
          puVar16 = (ushort *)((long)__src + __n);
          __src = puVar16 + 1;
          uVar8 = *puVar16;
          pcVar14 = pcVar11 + -(ulong)uVar8;
          if (((uVar12 == 0xf) || (uVar8 < 8)) || (pcVar14 < dest + -prefixSize)) goto LAB_0029ba4b;
          *(undefined8 *)pcVar11 = *(undefined8 *)pcVar14;
          *(undefined8 *)(pcVar11 + 8) = *(undefined8 *)(pcVar14 + 8);
          *(undefined2 *)(pcVar11 + 0x10) = *(undefined2 *)(pcVar14 + 0x10);
          __dest = pcVar11 + uVar12 + 4;
          puVar16 = __src;
        }
        if (pbVar2 + -0xf <= __src) goto LAB_0029bbc3;
        puVar16 = puVar16 + 1;
        lVar10 = 0;
        puVar13 = __src;
        do {
          __src = (ushort *)((long)puVar13 + 1);
          if (pbVar2 + -0xf < __src) goto LAB_0029bbc3;
          uVar8 = *puVar13;
          lVar10 = lVar10 + (ulong)(byte)uVar8;
          puVar16 = (ushort *)((long)puVar16 + 1);
          puVar13 = __src;
        } while ((ulong)(byte)uVar8 == 0xff);
        if (((lVar10 == -1) || (__n = lVar10 + 0xf, CARRY8((ulong)__dest,__n))) ||
           ((ulong)-(long)puVar16 < __n)) goto LAB_0029bbc3;
LAB_0029b99b:
        pcVar11 = __dest + __n;
        if ((pcVar3 + -0xc < pcVar11) ||
           (puVar16 = (ushort *)((long)__src + __n), pbVar2 + -8 < puVar16)) {
          if (((byte *)((long)__src + __n) == pbVar2) && (pcVar11 <= pcVar3)) {
            memmove(__dest,__src,__n);
            local_50 = (int)dest;
            return (int)pcVar11 - local_50;
          }
LAB_0029bbc3:
          local_38 = (int)source;
          return ~(uint)__src + local_38;
        }
        do {
          *(undefined8 *)__dest = *(undefined8 *)__src;
          __dest = __dest + 8;
          __src = __src + 4;
        } while (__dest < pcVar11);
        uVar8 = *puVar16;
        __src = puVar16 + 1;
        pcVar14 = pcVar11 + -(ulong)uVar8;
        uVar12 = (ulong)(bVar4 & 0xf);
LAB_0029ba4b:
        if ((int)uVar12 == 0xf) {
          lVar10 = 0;
          puVar16 = __src;
          do {
            __src = (ushort *)((long)puVar16 + 1);
            if (pbVar2 + -4 < __src) goto LAB_0029bbc3;
            uVar9 = *puVar16;
            lVar10 = lVar10 + (ulong)(byte)uVar9;
            puVar16 = __src;
          } while ((ulong)(byte)uVar9 == 0xff);
          uVar12 = lVar10 + 0xf;
          if ((lVar10 == -1) || (CARRY8((ulong)pcVar11,uVar12))) goto LAB_0029bbc3;
        }
        if (pcVar14 < dest + -prefixSize) goto LAB_0029bbc3;
        if (uVar8 < 8) {
          pcVar11[0] = '\0';
          pcVar11[1] = '\0';
          pcVar11[2] = '\0';
          pcVar11[3] = '\0';
          *pcVar11 = *pcVar14;
          pcVar11[1] = pcVar14[1];
          pcVar11[2] = pcVar14[2];
          pcVar11[3] = pcVar14[3];
          uVar6 = inc32table[uVar8];
          *(undefined4 *)(pcVar11 + 4) = *(undefined4 *)(pcVar14 + uVar6);
          pcVar14 = pcVar14 + ((ulong)uVar6 - (long)dec64table[uVar8]);
        }
        else {
          *(undefined8 *)pcVar11 = *(undefined8 *)pcVar14;
          pcVar14 = pcVar14 + 8;
        }
        __dest = pcVar11 + uVar12 + 4;
        pcVar15 = pcVar11 + 8;
        puVar16 = __src;
        if (pcVar3 + -0xc < __dest) {
          if (pcVar3 + -5 < __dest) goto LAB_0029bbc3;
          pcVar11 = pcVar15;
          pcVar17 = pcVar14;
          if (pcVar15 < pcVar1) {
            do {
              *(undefined8 *)pcVar11 = *(undefined8 *)pcVar17;
              pcVar11 = pcVar11 + 8;
              pcVar17 = pcVar17 + 8;
            } while (pcVar11 < pcVar1);
            pcVar14 = pcVar14 + ((long)pcVar1 - (long)pcVar15);
            pcVar15 = pcVar1;
          }
          for (; pcVar15 < __dest; pcVar15 = pcVar15 + 1) {
            cVar5 = *pcVar14;
            pcVar14 = pcVar14 + 1;
            *pcVar15 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar15 = *(undefined8 *)pcVar14;
          if (0x10 < uVar12 + 4) {
            pcVar11 = pcVar11 + 0x10;
            do {
              pcVar14 = pcVar14 + 8;
              *(undefined8 *)pcVar11 = *(undefined8 *)pcVar14;
              pcVar11 = pcVar11 + 8;
            } while (pcVar11 < __dest);
          }
        }
      } while( true );
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}